

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O0

void * memory_allocator_allocate(memory_allocator allocator,size_t size)

{
  void *pvVar1;
  undefined8 in_RSI;
  long *in_RDI;
  void *data;
  
  pvVar1 = (void *)(**(code **)(*in_RDI + 8))(in_RDI[1],in_RSI);
  if (pvVar1 == (void *)0x0) {
    in_RDI[3] = in_RDI[3] + 1;
  }
  else {
    in_RDI[2] = in_RDI[2] + 1;
  }
  return pvVar1;
}

Assistant:

void *memory_allocator_allocate(memory_allocator allocator, size_t size)
{
	void *data = allocator->iface->allocate(allocator->impl, size);

	if (data == NULL)
	{
		++allocator->size.bad_alloc;
	}
	else
	{
		++allocator->size.alloc;
	}

	return data;
}